

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

String * __thiscall
kj::HttpHeaders::serialize
          (String *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<const_char> word1,
          ArrayPtr<const_char> word2,ArrayPtr<const_char> word3,
          ArrayPtr<const_kj::StringPtr> connectionHeaders)

{
  ulong uVar1;
  void *__src;
  Header *pHVar2;
  String *pSVar3;
  Header *header;
  Header *pHVar4;
  StringPtr *pSVar5;
  ulong uVar6;
  unsigned_long i_1;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  unsigned_long i;
  char *pcVar10;
  Fault FVar11;
  Fault f_1;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  StringPtr space;
  Fault local_d0;
  StringPtr local_c8;
  String *local_b8;
  ulong local_b0;
  StringPtr *local_a8;
  ulong local_a0;
  Fault local_98;
  DebugComparison<char_*&,_char_*> local_90;
  HttpHeaders *local_68;
  ArrayPtr<const_char> local_60;
  StringPtr local_50;
  ArrayPtr<const_char> local_40;
  
  local_40.size_ = word2.size_;
  local_40.ptr = word2.ptr;
  local_60.size_ = word1.size_;
  local_60.ptr = word1.ptr;
  local_50.content.ptr = " ";
  local_50.content.size_ = 2;
  local_c8.content.ptr = "\r\n";
  local_c8.content.size_ = 3;
  local_90.right = (char *)(this->indexedHeaders).size_;
  local_90.left = (char **)connectionHeaders.size_;
  local_90.op.content.ptr = " <= ";
  local_90.op.content.size_ = 5;
  local_90.result = connectionHeaders.size_ <= local_90.right;
  if (local_90.right < connectionHeaders.size_) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x441,FAILED,"connectionHeaders.size() <= indexedHeaders.size()","_kjCondition,",
               (DebugComparison<unsigned_long,_unsigned_long> *)&local_90);
    kj::_::Debug::Fault::fatal(&local_d0);
  }
  sVar8 = 2;
  if (local_60.size_ != 0) {
    sVar8 = word3.size_ + 6 + local_40.size_ + local_60.size_;
  }
  if (local_90.right != (char *)0x0) {
    lVar9 = 8;
    pcVar10 = (char *)0x0;
    do {
      pSVar5 = (this->indexedHeaders).ptr;
      if (pcVar10 < connectionHeaders.size_) {
        pSVar5 = connectionHeaders.ptr;
      }
      uVar6 = *(ulong *)((long)&(pSVar5->content).ptr + lVar9);
      if (1 < uVar6) {
        sVar8 = sVar8 + uVar6 +
                (this->table->namesById).builder.ptr[(ulong)pcVar10 & 0xffffffff].content.size_ + 2;
      }
      pcVar10 = pcVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (local_90.right != pcVar10);
  }
  for (pHVar4 = (this->unindexedHeaders).builder.ptr; pHVar4 != (this->unindexedHeaders).builder.pos
      ; pHVar4 = pHVar4 + 1) {
    sVar8 = sVar8 + (pHVar4->name).content.size_ + (pHVar4->value).content.size_ + 2;
  }
  heapString(__return_storage_ptr__,sVar8);
  local_d0.exception = (Exception *)(__return_storage_ptr__->content).size_;
  if (local_d0.exception != (Exception *)0x0) {
    local_d0.exception = (Exception *)(__return_storage_ptr__->content).ptr;
  }
  local_b8 = __return_storage_ptr__;
  if (local_60.size_ != 0) {
    local_d0.exception =
         (Exception *)
         kj::_::
         fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                   (local_d0.exception,&local_60,&local_50,&local_40,&local_50,&word3,&local_c8);
  }
  uVar6 = (this->indexedHeaders).size_;
  if (uVar6 != 0) {
    lVar9 = 8;
    uVar7 = 0;
    local_a8 = connectionHeaders.ptr;
    local_b0 = connectionHeaders.size_;
    local_a0 = uVar6;
    local_68 = this;
    do {
      FVar11.exception = local_d0.exception;
      pSVar5 = connectionHeaders.ptr;
      if (connectionHeaders.size_ <= uVar7) {
        pSVar5 = (this->indexedHeaders).ptr;
      }
      uVar1 = *(ulong *)((long)&(pSVar5->content).ptr + lVar9);
      if (1 < uVar1) {
        __src = *(void **)((long)pSVar5 + lVar9 + -8);
        pSVar5 = (this->table->namesById).builder.ptr;
        pcVar10 = pSVar5[uVar7 & 0xffffffff].content.ptr;
        sVar8 = pSVar5[uVar7 & 0xffffffff].content.size_;
        if (pcVar10 != pcVar10 + (sVar8 - 1)) {
          memcpy(local_d0.exception,pcVar10,sVar8 - 1);
          FVar11.exception = (Exception *)((long)(FVar11.exception)->trace + (sVar8 - 0x69));
        }
        this = local_68;
        *(undefined2 *)&((FVar11.exception)->ownFile).content.ptr = 0x203a;
        FVar11.exception = (Exception *)((long)&((FVar11.exception)->ownFile).content.ptr + 2);
        if (__src != (void *)((long)__src + (uVar1 - 1))) {
          memcpy(FVar11.exception,__src,uVar1 - 1);
          FVar11.exception = (Exception *)((long)(FVar11.exception)->trace + (uVar1 - 0x69));
        }
        sVar8 = local_c8.content.size_;
        uVar6 = local_a0;
        connectionHeaders.ptr = local_a8;
        connectionHeaders.size_ = local_b0;
        if (local_c8.content.ptr != local_c8.content.ptr + (local_c8.content.size_ - 1)) {
          memcpy(FVar11.exception,local_c8.content.ptr,local_c8.content.size_ - 1);
          uVar6 = local_a0;
          connectionHeaders.ptr = local_a8;
          connectionHeaders.size_ = local_b0;
          FVar11.exception = (Exception *)((long)(FVar11.exception)->trace + (sVar8 - 0x69));
        }
      }
      local_d0.exception = FVar11.exception;
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar6 != uVar7);
  }
  pSVar3 = local_b8;
  pHVar2 = (this->unindexedHeaders).builder.pos;
  FVar11.exception = local_d0.exception;
  sVar8 = local_c8.content.size_;
  for (pHVar4 = (this->unindexedHeaders).builder.ptr; local_d0.exception = FVar11.exception,
      local_c8.content.size_ = sVar8, pHVar4 != pHVar2; pHVar4 = pHVar4 + 1) {
    pcVar10 = (pHVar4->name).content.ptr;
    sVar8 = (pHVar4->name).content.size_;
    if (pcVar10 != pcVar10 + (sVar8 - 1)) {
      memcpy(FVar11.exception,pcVar10,sVar8 - 1);
      FVar11.exception = (Exception *)((long)(FVar11.exception)->trace + (sVar8 - 0x69));
    }
    *(undefined2 *)&((FVar11.exception)->ownFile).content.ptr = 0x203a;
    FVar11.exception = (Exception *)((long)&((FVar11.exception)->ownFile).content.ptr + 2);
    pcVar10 = (pHVar4->value).content.ptr;
    sVar8 = (pHVar4->value).content.size_;
    if (pcVar10 != pcVar10 + (sVar8 - 1)) {
      memcpy(FVar11.exception,pcVar10,sVar8 - 1);
      FVar11.exception = (Exception *)((long)(FVar11.exception)->trace + (sVar8 - 0x69));
    }
    sVar8 = local_c8.content.size_;
    if (local_c8.content.ptr != local_c8.content.ptr + (local_c8.content.size_ - 1)) {
      memcpy(FVar11.exception,local_c8.content.ptr,local_c8.content.size_ - 1);
      FVar11.exception = (Exception *)((long)(FVar11.exception)->trace + (sVar8 - 0x69));
    }
    sVar8 = local_c8.content.size_;
  }
  if (local_c8.content.ptr != local_c8.content.ptr + (sVar8 - 1)) {
    memcpy(FVar11.exception,local_c8.content.ptr,sVar8 - 1);
    FVar11.exception = (Exception *)((long)(FVar11.exception)->trace + (sVar8 - 0x69));
  }
  local_90.left = (char **)&local_d0;
  sVar8 = (pSVar3->content).size_;
  local_90.right = (pSVar3->content).ptr + (sVar8 - 1);
  if (sVar8 == 0) {
    local_90.right = (char *)0x0;
  }
  local_90.op.content.ptr = " == ";
  local_90.op.content.size_ = 5;
  local_90.result = FVar11.exception == (Exception *)local_90.right;
  if (local_90.result) {
    return pSVar3;
  }
  local_d0.exception = FVar11.exception;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
            (&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x45d,FAILED,"ptr == result.end()","_kjCondition,",&local_90);
  kj::_::Debug::Fault::fatal(&local_98);
}

Assistant:

kj::String HttpHeaders::serialize(kj::ArrayPtr<const char> word1,
                                  kj::ArrayPtr<const char> word2,
                                  kj::ArrayPtr<const char> word3,
                                  kj::ArrayPtr<const kj::StringPtr> connectionHeaders) const {
  const kj::StringPtr space = " ";
  const kj::StringPtr newline = "\r\n";
  const kj::StringPtr colon = ": ";

  size_t size = 2;  // final \r\n
  if (word1 != nullptr) {
    size += word1.size() + word2.size() + word3.size() + 4;
  }
  KJ_ASSERT(connectionHeaders.size() <= indexedHeaders.size());
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      size += table->idToString(HttpHeaderId(table, i)).size() + value.size() + 4;
    }
  }
  for (auto& header: unindexedHeaders) {
    size += header.name.size() + header.value.size() + 4;
  }

  String result = heapString(size);
  char* ptr = result.begin();

  if (word1 != nullptr) {
    ptr = kj::_::fill(ptr, word1, space, word2, space, word3, newline);
  }
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      ptr = kj::_::fill(ptr, table->idToString(HttpHeaderId(table, i)), colon, value, newline);
    }
  }
  for (auto& header: unindexedHeaders) {
    ptr = kj::_::fill(ptr, header.name, colon, header.value, newline);
  }
  ptr = kj::_::fill(ptr, newline);

  KJ_ASSERT(ptr == result.end());
  return result;
}